

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O3

void __thiscall cmComputeLinkDepends::VisitComponent(cmComputeLinkDepends *this,uint c)

{
  pointer pcVar1;
  long lVar2;
  int iVar3;
  __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
  __tmp;
  long lVar4;
  
  pcVar1 = (this->ComponentVisited).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar1[c] == '\0') {
    pcVar1[c] = '\x01';
    lVar4 = *(long *)&(((this->CCG)._M_t.
                        super___uniq_ptr_impl<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmComputeComponentGraph_*,_std::default_delete<cmComputeComponentGraph>_>
                        .super__Head_base<0UL,_cmComputeComponentGraph_*,_false>._M_head_impl)->
                      ComponentGraph).
                      super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                      super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>;
    lVar2 = *(long *)(lVar4 + (long)(int)c * 0x18);
    for (lVar4 = *(long *)(lVar4 + 8 + (long)(int)c * 0x18); lVar4 != lVar2; lVar4 = lVar4 + -0x18)
    {
      VisitComponent(this,*(uint *)(lVar4 + -0x18));
    }
    iVar3 = this->ComponentOrderId + -1;
    this->ComponentOrderId = iVar3;
    (this->ComponentOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start[c] = iVar3;
  }
  return;
}

Assistant:

void cmComputeLinkDepends::VisitComponent(unsigned int c)
{
  // Check if the node has already been visited.
  if (this->ComponentVisited[c]) {
    return;
  }

  // We are now visiting this component so mark it.
  this->ComponentVisited[c] = 1;

  // Visit the neighbors of the component first.
  // Run in reverse order so the topological order will preserve the
  // original order where there are no constraints.
  EdgeList const& nl = this->CCG->GetComponentGraphEdges(c);
  for (cmGraphEdge const& edge : cmReverseRange(nl)) {
    this->VisitComponent(edge);
  }

  // Assign an ordering id to this component.
  this->ComponentOrder[c] = --this->ComponentOrderId;
}